

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::TweakSpeeds(APlayerPawn *this,double *forward,double *side)

{
  double dVar1;
  AInventory *pAVar2;
  TObjPtr<AInventory> *obj;
  double extraout_XMM0_Qa;
  double dVar3;
  
  if ((this->super_AActor).health <= this->RunHealth) {
    dVar1 = *forward;
    dVar3 = 6400.0;
    if (dVar1 <= 6400.0) {
      dVar3 = dVar1;
    }
    *forward = (double)(~-(ulong)(-6400.0 < dVar1) & 0xc0b9000000000000 |
                       (ulong)dVar3 & -(ulong)(-6400.0 < dVar1));
    dVar1 = *side;
    dVar3 = 6144.0;
    if (dVar1 <= 6144.0) {
      dVar3 = dVar1;
    }
    *side = (double)(~-(ulong)(-6144.0 < dVar1) & 0xc0b8000000000000 |
                    (ulong)dVar3 & -(ulong)(-6144.0 < dVar1));
  }
  *forward = *forward * (&this->ForwardMove1)[12800.0 <= ABS(*forward)];
  *side = *side * (&this->SideMove1)[10240.0 <= ABS(*side)];
  if (((this->super_AActor).player)->morphTics == 0) {
    obj = &(this->super_AActor).Inventory;
    pAVar2 = GC::ReadBarrier<AInventory>((AInventory **)obj);
    if (pAVar2 != (AInventory *)0x0) {
      pAVar2 = GC::ReadBarrier<AInventory>((AInventory **)obj);
      (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3d])(pAVar2);
      *forward = *forward * extraout_XMM0_Qa;
      *side = extraout_XMM0_Qa * *side;
    }
  }
  return;
}

Assistant:

void APlayerPawn::TweakSpeeds (double &forward, double &side)
{
	// Strife's player can't run when its health is below 10
	if (health <= RunHealth)
	{
		forward = clamp<double>(forward, -0x1900, 0x1900);
		side = clamp<double>(side, -0x1800, 0x1800);
	}

	// [GRB]
	if (fabs(forward) < 0x3200)
	{
		forward *= ForwardMove1;
	}
	else
	{
		forward *= ForwardMove2;
	}

	if (fabs(side) < 0x2800)
	{
		side *= SideMove1;
	}
	else
	{
		side *= SideMove2;
	}

	if (!player->morphTics && Inventory != NULL)
	{
		double factor = Inventory->GetSpeedFactor ();
		forward *= factor;
		side *= factor;
	}
}